

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

bool __thiscall gmlc::networking::TcpAcceptor::start(TcpAcceptor *this,pointer *conn)

{
  bool bVar1;
  AcceptingStates AVar2;
  element_type *peVar3;
  anon_class_40_3_0ec333df *this_00;
  int in_ECX;
  anon_class_40_3_0ec333df *__f;
  int __type;
  int __n;
  int iVar4;
  int __fd;
  __shared_ptr *in_RSI;
  allocator<char> *in_RDI;
  shared_ptr<gmlc::networking::TcpAcceptor> ptr;
  shared_ptr<gmlc::networking::Socket> socket;
  enable_shared_from_this<gmlc::networking::TcpAcceptor> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  TriggerVariable *in_stack_fffffffffffffec8;
  TcpAcceptor *in_stack_fffffffffffffed0;
  TcpAcceptor *this_01;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined1 local_b8 [48];
  undefined1 local_88 [23];
  undefined1 local_71 [112];
  byte local_1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  iVar4 = (int)in_RSI;
  if (bVar1) {
    AVar2 = std::atomic::operator_cast_to_AcceptingStates
                      ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)0x7e83ef);
    if (AVar2 == CONNECTED) {
      bVar1 = concurrency::TriggerVariable::activate(in_stack_fffffffffffffec8);
      iVar4 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x7e850c);
        TcpConnection::socket((TcpConnection *)local_88,(int)peVar3,__type,in_ECX);
        ::asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
                  ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)(in_RDI + 0x30),
                   0x1000,__n);
        std::enable_shared_from_this<gmlc::networking::TcpAcceptor>::shared_from_this
                  (in_stack_fffffffffffffeb8);
        this_00 = (anon_class_40_3_0ec333df *)
                  std::
                  __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x7e8552);
        __f = (anon_class_40_3_0ec333df *)(in_RDI + 0x30);
        std::shared_ptr<gmlc::networking::TcpAcceptor>::shared_ptr
                  ((shared_ptr<gmlc::networking::TcpAcceptor> *)this_00,
                   (shared_ptr<gmlc::networking::TcpAcceptor> *)in_stack_fffffffffffffeb8);
        std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
                  ((shared_ptr<gmlc::networking::TcpConnection> *)this_00,
                   (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffeb8);
        std::function<void(std::error_code_const&)>::
        function<gmlc::networking::TcpAcceptor::start(std::shared_ptr<gmlc::networking::TcpConnection>)::__0,void>
                  ((function<void_(const_std::error_code_&)> *)in_stack_fffffffffffffed0,__f);
        (**(code **)&(this_00->this->acceptor_).impl_.implementation_.super_base_implementation_type
        )(this_00,__f,local_b8);
        std::function<void_(const_std::error_code_&)>::~function
                  ((function<void_(const_std::error_code_&)> *)0x7e85d2);
        start(std::shared_ptr<gmlc::networking::TcpConnection>)::$_0::~__0(this_00);
        local_1 = 1;
        std::shared_ptr<gmlc::networking::TcpAcceptor>::~shared_ptr
                  ((shared_ptr<gmlc::networking::TcpAcceptor> *)0x7e85f1);
        std::shared_ptr<gmlc::networking::Socket>::~shared_ptr
                  ((shared_ptr<gmlc::networking::Socket> *)0x7e85fe);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_RDI);
        __fd = 1;
        logger(in_stack_fffffffffffffed0,iVar4,(string *)in_stack_fffffffffffffec0);
        std::__cxx11::string::~string(in_stack_fffffffffffffec0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x7e86d2);
        TcpConnection::close(peVar3,__fd);
        local_1 = 0;
      }
    }
    else {
      peVar3 = std::
               __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x7e8402);
      TcpConnection::close(peVar3,iVar4);
      bVar1 = concurrency::TriggerVariable::isActive((TriggerVariable *)0x7e841b);
      if (bVar1) {
        concurrency::TriggerVariable::trigger(in_stack_fffffffffffffec8);
      }
      iVar4 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      this_01 = (TcpAcceptor *)local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_RDI);
      logger(this_01,iVar4,(string *)in_stack_fffffffffffffec0);
      std::__cxx11::string::~string(in_stack_fffffffffffffec0);
      std::allocator<char>::~allocator((allocator<char> *)local_71);
      local_1 = 0;
    }
  }
  else {
    bVar1 = concurrency::TriggerVariable::isActive((TriggerVariable *)0x7e8314);
    if (bVar1) {
      concurrency::TriggerVariable::trigger(in_stack_fffffffffffffec8);
    }
    iVar4 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_RDI);
    logger(in_stack_fffffffffffffed0,iVar4,(string *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(in_stack_fffffffffffffec0);
    std::allocator<char>::~allocator((allocator<char> *)(local_71 + 0x38));
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool TcpAcceptor::start(TcpConnection::pointer conn)
{
    if (!conn) {
        if (accepting.isActive()) {
            accepting.trigger();
        }
        logger(0, "tcpconnection is not valid");
        return false;
    }
    if (state != AcceptingStates::CONNECTED) {
        conn->close();
        if (accepting.isActive()) {
            accepting.trigger();
        }
        logger(1, "acceptor is not in a connected state");
        return false;
    }
    if (accepting.activate()) {
        auto socket = conn->socket();
        acceptor_.listen();
        auto ptr = shared_from_this();
        socket->use_with_acceptor(
            acceptor_,
            [this, apointer = std::move(ptr), connection = std::move(conn)](
                const std::error_code& error) {
                handle_accept(apointer, connection, error);
            });
        return true;
    }

    logger(1, "acceptor is already active");
    conn->close();
    return false;
}